

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

void dump_mpp_frame_to_file(MppFrame frame,FILE *fp)

{
  size_t sVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  RK_U8 *pRVar10;
  RK_U8 *pRVar11;
  ulong uVar12;
  RK_U8 *pRVar13;
  RK_U8 *pRVar14;
  uint uVar15;
  RK_U32 RVar16;
  RK_U8 *base_y;
  
  if (frame == (MppFrame)0x0 || fp == (FILE *)0x0) {
    return;
  }
  uVar7 = mpp_frame_get_width();
  uVar2 = mpp_frame_get_height(frame);
  uVar8 = mpp_frame_get_hor_stride(frame);
  iVar3 = mpp_frame_get_ver_stride(frame);
  uVar4 = mpp_frame_get_fmt(frame);
  lVar9 = mpp_frame_get_buffer(frame);
  if (lVar9 == 0) {
    return;
  }
  pRVar10 = (RK_U8 *)mpp_buffer_get_ptr_with_caller(lVar9,"dump_mpp_frame_to_file");
  if ((uVar4 & 0xf0000) == 0x10000) {
    uVar5 = uVar4 & 0x1ffff;
    if ((uVar4 >> 0x18 & 1) == 0) {
      uVar5 = uVar4;
    }
    if ((uVar4 & 0x1ffff) < 0x10010) {
      uVar4 = uVar5;
    }
  }
  uVar5 = uVar4 & 0xfffff;
  uVar15 = (uint)uVar7;
  iVar6 = (int)uVar8;
  if (0xffff < uVar5) {
    if (5 < uVar5 - 0x10000) {
      if (uVar5 - 0x1000a < 4) {
        pRVar11 = (RK_U8 *)mpp_osal_malloc("dump_mpp_frame_to_file",uVar2 * uVar15 * 4);
        if (uVar2 != 0) {
          do {
            fwrite(pRVar10,1,(ulong)(uVar15 << 2),(FILE *)fp);
            pRVar10 = pRVar10 + (uVar8 & 0xffffffff);
            uVar2 = uVar2 - 1;
          } while (uVar2 != 0);
        }
      }
      else {
        if (uVar5 != 0x10006) goto switchD_0010cce6_caseD_3;
        pRVar11 = (RK_U8 *)mpp_osal_malloc("dump_mpp_frame_to_file",uVar2 * uVar15 * 3);
        if (uVar2 != 0) {
          do {
            fwrite(pRVar10,1,(ulong)(uVar15 * 3),(FILE *)fp);
            pRVar10 = pRVar10 + (uVar8 & 0xffffffff);
            uVar2 = uVar2 - 1;
          } while (uVar2 != 0);
        }
      }
      goto LAB_0010d179;
    }
switchD_0010cce6_caseD_8:
    pRVar11 = (RK_U8 *)mpp_osal_malloc("dump_mpp_frame_to_file",uVar2 * uVar15 * 2);
    if (uVar2 != 0) {
      do {
        fwrite(pRVar10,1,(ulong)(uVar15 * 2),(FILE *)fp);
        pRVar10 = pRVar10 + (uVar8 & 0xffffffff);
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
    }
    goto LAB_0010d179;
  }
  switch(uVar5) {
  case 0:
  case 5:
    if (uVar2 == 0) {
      return;
    }
    pRVar11 = pRVar10 + (uint)(iVar3 * iVar6);
    uVar4 = uVar2;
    do {
      fwrite(pRVar10,1,uVar7 & 0xffffffff,(FILE *)fp);
      pRVar10 = pRVar10 + (uVar8 & 0xffffffff);
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
    if (uVar2 == 1) {
      return;
    }
    uVar2 = uVar2 >> 1;
    do {
      fwrite(pRVar11,1,uVar7 & 0xffffffff,(FILE *)fp);
      pRVar11 = pRVar11 + (uVar8 & 0xffffffff);
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
    return;
  case 1:
    sVar1 = (uVar7 & 0xffffffff) * 2;
    pRVar11 = (RK_U8 *)mpp_osal_malloc("dump_mpp_frame_to_file");
    if (pRVar11 == (RK_U8 *)0x0) {
LAB_0010d354:
      _mpp_log_l(4,"utils","tmp_line malloc fail",0);
      return;
    }
    if (uVar2 != 0) {
      pRVar14 = pRVar10 + (uint)(iVar3 * iVar6);
      uVar15 = uVar15 + 7;
      uVar4 = 0;
      do {
        if (7 < uVar15) {
          RVar16 = 0;
          do {
            rearrange_pix(pRVar11,pRVar10,RVar16);
            RVar16 = RVar16 + 1;
          } while (uVar15 >> 3 != RVar16);
        }
        fwrite(pRVar11,sVar1,1,(FILE *)fp);
        uVar4 = uVar4 + 1;
        pRVar10 = pRVar10 + (uVar8 & 0xffffffff);
      } while (uVar4 != uVar2);
      if (uVar2 != 1) {
        uVar4 = 0;
        do {
          if (7 < uVar15) {
            RVar16 = 0;
            do {
              rearrange_pix(pRVar11,pRVar14,RVar16);
              RVar16 = RVar16 + 1;
            } while (uVar15 >> 3 != RVar16);
          }
          fwrite(pRVar11,sVar1,1,(FILE *)fp);
          uVar4 = uVar4 + 1;
          pRVar14 = pRVar14 + (uVar8 & 0xffffffff);
        } while (uVar4 != uVar2 >> 1);
      }
    }
    break;
  case 2:
    pRVar11 = (RK_U8 *)mpp_osal_malloc("dump_mpp_frame_to_file",iVar6 * uVar2 * 2);
    uVar4 = uVar2 * uVar15;
    if (uVar2 != 0) {
      pRVar14 = pRVar10 + (uint)(iVar3 * iVar6);
      uVar5 = uVar2;
      do {
        fwrite(pRVar10,1,uVar7 & 0xffffffff,(FILE *)fp);
        pRVar10 = pRVar10 + (uVar8 & 0xffffffff);
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
      uVar7 = uVar7 >> 1 & 0x7fffffff;
      uVar5 = 0;
      pRVar10 = pRVar11;
      do {
        if (1 < uVar15) {
          uVar12 = 0;
          do {
            pRVar10[uVar12] = pRVar14[uVar12 * 2];
            pRVar10[uVar12 + (uVar4 >> 1)] = pRVar14[uVar12 * 2 + 1];
            uVar12 = uVar12 + 1;
          } while (uVar7 != uVar12);
        }
        pRVar10 = pRVar10 + uVar7;
        uVar5 = uVar5 + 1;
        pRVar14 = pRVar14 + (uVar8 & 0xffffffff);
      } while (uVar5 != uVar2);
    }
    goto LAB_0010d313;
  default:
switchD_0010cce6_caseD_3:
    _mpp_log_l(2,"utils","not supported format %d\n",0,uVar4);
    return;
  case 4:
    if (uVar2 != 0) {
      pRVar11 = pRVar10 + (uint)(iVar3 * iVar6);
      uVar4 = uVar2;
      do {
        fwrite(pRVar10,1,uVar7 & 0xffffffff,(FILE *)fp);
        pRVar10 = pRVar10 + (uVar8 & 0xffffffff);
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
      if (uVar2 != 1) {
        uVar5 = uVar2 >> 1;
        uVar7 = uVar7 >> 1 & 0x7fffffff;
        uVar8 = uVar8 >> 1 & 0x7fffffff;
        uVar4 = uVar5;
        do {
          fwrite(pRVar11,1,uVar7,(FILE *)fp);
          pRVar11 = pRVar11 + uVar8;
          uVar4 = uVar4 - 1;
        } while (uVar4 != 0);
        if (uVar2 != 1) {
          do {
            fwrite(pRVar11,1,uVar7,(FILE *)fp);
            pRVar11 = pRVar11 + uVar8;
            uVar5 = uVar5 - 1;
          } while (uVar5 != 0);
        }
      }
    }
    return;
  case 8:
  case 9:
  case 10:
  case 0xb:
    goto switchD_0010cce6_caseD_8;
  case 0xc:
    pRVar11 = (RK_U8 *)mpp_osal_malloc("dump_mpp_frame_to_file",iVar6 * uVar2);
    if (uVar2 != 0) {
      do {
        fwrite(pRVar10,1,uVar7 & 0xffffffff,(FILE *)fp);
        pRVar10 = pRVar10 + (uVar8 & 0xffffffff);
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
    }
    break;
  case 0xf:
    pRVar11 = (RK_U8 *)mpp_osal_malloc("dump_mpp_frame_to_file",iVar6 * uVar2 * 2);
    if (uVar2 != 0) {
      pRVar14 = pRVar10 + (uint)(iVar3 * iVar6);
      uVar7 = uVar7 & 0xffffffff;
      uVar4 = uVar2;
      do {
        fwrite(pRVar10,1,uVar7,(FILE *)fp);
        pRVar10 = pRVar10 + (uVar8 & 0xffffffff);
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
      uVar4 = 0;
      pRVar10 = pRVar11;
      do {
        if (uVar15 != 0) {
          uVar8 = 0;
          pRVar13 = pRVar10;
          do {
            *pRVar13 = pRVar14[uVar8 & 0xffffffff];
            pRVar13[uVar2 * uVar15] = pRVar14[(int)uVar8 + 1];
            pRVar13 = pRVar13 + 1;
            uVar8 = uVar8 + 2;
          } while (uVar7 * 2 != uVar8);
        }
        pRVar10 = pRVar10 + uVar7;
        uVar4 = uVar4 + 1;
        pRVar14 = pRVar14 + (uint)(iVar6 * 2);
      } while (uVar4 != uVar2);
    }
    uVar4 = uVar2 * uVar15 * 2;
LAB_0010d313:
    fwrite(pRVar11,1,(ulong)uVar4,(FILE *)fp);
    break;
  case 0x11:
    sVar1 = (uVar7 & 0xffffffff) * 2;
    pRVar11 = (RK_U8 *)mpp_osal_malloc("dump_mpp_frame_to_file");
    if (pRVar11 == (RK_U8 *)0x0) goto LAB_0010d354;
    if (uVar2 != 0) {
      pRVar14 = pRVar10 + (uint)(iVar3 * iVar6);
      uVar15 = uVar15 + 7;
      uVar4 = 0;
      do {
        if (7 < uVar15) {
          RVar16 = 0;
          do {
            rearrange_pix(pRVar11,pRVar10,RVar16);
            RVar16 = RVar16 + 1;
          } while (uVar15 >> 3 != RVar16);
        }
        fwrite(pRVar11,sVar1,1,(FILE *)fp);
        uVar4 = uVar4 + 1;
        pRVar10 = pRVar10 + (uVar8 & 0xffffffff);
      } while (uVar4 != uVar2);
      if (uVar2 * 2 != 0) {
        iVar3 = 0;
        do {
          if (7 < uVar15) {
            RVar16 = 0;
            do {
              rearrange_pix(pRVar11,pRVar14,RVar16);
              RVar16 = RVar16 + 1;
            } while (uVar15 >> 3 != RVar16);
          }
          fwrite(pRVar11,sVar1,1,(FILE *)fp);
          iVar3 = iVar3 + 1;
          pRVar14 = pRVar14 + (uVar8 & 0xffffffff);
        } while (iVar3 != uVar2 * 2);
      }
    }
  }
LAB_0010d179:
  mpp_osal_free("dump_mpp_frame_to_file",pRVar11);
  return;
}

Assistant:

void dump_mpp_frame_to_file(MppFrame frame, FILE *fp)
{
    RK_U32 width    = 0;
    RK_U32 height   = 0;
    RK_U32 h_stride = 0;
    RK_U32 v_stride = 0;
    MppFrameFormat fmt  = MPP_FMT_YUV420SP;
    MppBuffer buffer    = NULL;
    RK_U8 *base = NULL;

    if (NULL == fp || NULL == frame)
        return ;

    width    = mpp_frame_get_width(frame);
    height   = mpp_frame_get_height(frame);
    h_stride = mpp_frame_get_hor_stride(frame);
    v_stride = mpp_frame_get_ver_stride(frame);
    fmt      = mpp_frame_get_fmt(frame);
    buffer   = mpp_frame_get_buffer(frame);

    if (NULL == buffer)
        return ;

    base = (RK_U8 *)mpp_buffer_get_ptr(buffer);

    if (MPP_FRAME_FMT_IS_RGB(fmt) && MPP_FRAME_FMT_IS_LE(fmt)) {
        fmt &= MPP_FRAME_FMT_MASK;
    }
    switch (fmt & MPP_FRAME_FMT_MASK) {
    case MPP_FMT_YUV422SP : {
        /* YUV422SP -> YUV422P for better display */
        RK_U32 i, j;
        RK_U8 *base_y = base;
        RK_U8 *base_c = base + h_stride * v_stride;
        RK_U8 *tmp = mpp_malloc(RK_U8, h_stride * height * 2);
        RK_U8 *tmp_u = tmp;
        RK_U8 *tmp_v = tmp + width * height / 2;

        for (i = 0; i < height; i++, base_y += h_stride)
            fwrite(base_y, 1, width, fp);

        for (i = 0; i < height; i++, base_c += h_stride) {
            for (j = 0; j < width / 2; j++) {
                tmp_u[j] = base_c[2 * j + 0];
                tmp_v[j] = base_c[2 * j + 1];
            }
            tmp_u += width / 2;
            tmp_v += width / 2;
        }

        fwrite(tmp, 1, width * height, fp);
        mpp_free(tmp);
    } break;
    case MPP_FMT_YUV420SP_VU :
    case MPP_FMT_YUV420SP : {
        RK_U32 i;
        RK_U8 *base_y = base;
        RK_U8 *base_c = base + h_stride * v_stride;

        for (i = 0; i < height; i++, base_y += h_stride) {
            fwrite(base_y, 1, width, fp);
        }
        for (i = 0; i < height / 2; i++, base_c += h_stride) {
            fwrite(base_c, 1, width, fp);
        }
    } break;
    case MPP_FMT_YUV420P : {
        RK_U32 i;
        RK_U8 *base_y = base;
        RK_U8 *base_c = base + h_stride * v_stride;

        for (i = 0; i < height; i++, base_y += h_stride) {
            fwrite(base_y, 1, width, fp);
        }
        for (i = 0; i < height / 2; i++, base_c += h_stride / 2) {
            fwrite(base_c, 1, width / 2, fp);
        }
        for (i = 0; i < height / 2; i++, base_c += h_stride / 2) {
            fwrite(base_c, 1, width / 2, fp);
        }
    } break;
    case MPP_FMT_YUV420SP_10BIT : {
        RK_U32 i, k;
        RK_U8 *base_y = base;
        RK_U8 *base_c = base + h_stride * v_stride;
        RK_U8 *tmp_line = (RK_U8 *)mpp_malloc(RK_U16, width);

        if (!tmp_line) {
            mpp_log("tmp_line malloc fail");
            return;
        }

        for (i = 0; i < height; i++, base_y += h_stride) {
            for (k = 0; k < MPP_ALIGN(width, 8) / 8; k++)
                rearrange_pix(tmp_line, base_y, k);
            fwrite(tmp_line, width * sizeof(RK_U16), 1, fp);
        }

        for (i = 0; i < height / 2; i++, base_c += h_stride) {
            for (k = 0; k < MPP_ALIGN(width, 8) / 8; k++)
                rearrange_pix(tmp_line, base_c, k);
            fwrite(tmp_line, width * sizeof(RK_U16), 1, fp);
        }

        MPP_FREE(tmp_line);
    } break;
    case MPP_FMT_YUV444SP : {
        /* YUV444SP -> YUV444P for better display */
        RK_U32 i, j;
        RK_U8 *base_y = base;
        RK_U8 *base_c = base + h_stride * v_stride;
        RK_U8 *tmp = mpp_malloc(RK_U8, h_stride * height * 2);
        RK_U8 *tmp_u = tmp;
        RK_U8 *tmp_v = tmp + width * height;

        for (i = 0; i < height; i++, base_y += h_stride)
            fwrite(base_y, 1, width, fp);

        for (i = 0; i < height; i++, base_c += h_stride * 2) {
            for (j = 0; j < width; j++) {
                tmp_u[j] = base_c[2 * j + 0];
                tmp_v[j] = base_c[2 * j + 1];
            }
            tmp_u += width;
            tmp_v += width;
        }

        fwrite(tmp, 1, width * height * 2, fp);
        mpp_free(tmp);
    } break;
    case MPP_FMT_YUV444SP_10BIT : {
        RK_U32 i, k;
        RK_U8 *base_y = base;
        RK_U8 *base_c = base + h_stride * v_stride;
        RK_U8 *tmp_line = (RK_U8 *)mpp_malloc(RK_U16, width);

        if (!tmp_line) {
            mpp_log("tmp_line malloc fail");
            return;
        }

        for (i = 0; i < height; i++, base_y += h_stride) {
            for (k = 0; k < MPP_ALIGN(width, 8) / 8; k++)
                rearrange_pix(tmp_line, base_y, k);
            fwrite(tmp_line, width * sizeof(RK_U16), 1, fp);
        }

        for (i = 0; i < (height * 2); i++, base_c += h_stride) {
            for (k = 0; k < MPP_ALIGN(width, 8) / 8; k++)
                rearrange_pix(tmp_line, base_c, k);
            fwrite(tmp_line, width * sizeof(RK_U16), 1, fp);
        }

        MPP_FREE(tmp_line);
    } break;
    case MPP_FMT_YUV400: {
        RK_U32 i;
        RK_U8 *base_y = base;
        RK_U8 *tmp = mpp_malloc(RK_U8, h_stride * height);

        for (i = 0; i < height; i++, base_y += h_stride)
            fwrite(base_y, 1, width, fp);

        mpp_free(tmp);
    } break;
    case MPP_FMT_ARGB8888:
    case MPP_FMT_ABGR8888:
    case MPP_FMT_BGRA8888:
    case MPP_FMT_RGBA8888: {
        RK_U32 i;
        RK_U8 *base_y = base;
        RK_U8 *tmp = mpp_malloc(RK_U8, width * height * 4);

        for (i = 0; i < height; i++, base_y += h_stride)
            fwrite(base_y, 1, width * 4, fp);

        mpp_free(tmp);
    } break;
    case MPP_FMT_YUV422_YUYV:
    case MPP_FMT_YUV422_YVYU:
    case MPP_FMT_YUV422_UYVY:
    case MPP_FMT_YUV422_VYUY:
    case MPP_FMT_RGB565:
    case MPP_FMT_BGR565:
    case MPP_FMT_RGB555:
    case MPP_FMT_BGR555:
    case MPP_FMT_RGB444:
    case MPP_FMT_BGR444: {
        RK_U32 i;
        RK_U8 *base_y = base;
        RK_U8 *tmp = mpp_malloc(RK_U8, width * height * 2);

        for (i = 0; i < height; i++, base_y += h_stride)
            fwrite(base_y, 1, width * 2, fp);

        mpp_free(tmp);
    } break;
    case MPP_FMT_RGB888: {
        RK_U32 i;
        RK_U8 *base_y = base;
        RK_U8 *tmp = mpp_malloc(RK_U8, width * height * 3);

        for (i = 0; i < height; i++, base_y += h_stride)
            fwrite(base_y, 1, width * 3, fp);

        mpp_free(tmp);
    } break;
    default : {
        mpp_err("not supported format %d\n", fmt);
    } break;
    }
}